

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

Node * __thiscall llvm::yaml::KeyValueNode::getKey(KeyValueNode *this)

{
  TokenKind TVar1;
  Token *pTVar2;
  Node *this_00;
  undefined1 local_50 [56];
  
  if (this->Key != (Node *)0x0) {
    return this->Key;
  }
  pTVar2 = Node::peekNext(&this->super_Node);
  TVar1 = pTVar2->Kind;
  if ((TVar1 == TK_Error) || (TVar1 == TK_Value)) {
LAB_00dcadb9:
    this_00 = (Node *)Node::operator_new(0x48,&((((this->super_Node).Doc)->_M_t).
                                                super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                                .
                                                super__Head_base<0UL,_llvm::yaml::Document_*,_false>
                                               ._M_head_impl)->NodeAllocator,0x10);
    if (this_00 == (Node *)0x0) goto LAB_00dcae2c;
  }
  else {
    if (TVar1 == TK_Key) {
      Node::getNext((Token *)local_50,&this->super_Node);
      std::__cxx11::string::~string((string *)(local_50 + 0x18));
    }
    else if (TVar1 == TK_BlockEnd) goto LAB_00dcadb9;
    pTVar2 = Node::peekNext(&this->super_Node);
    if ((pTVar2->Kind != TK_Value) && (pTVar2->Kind != TK_BlockEnd)) {
      this_00 = Node::parseBlockNode(&this->super_Node);
      goto LAB_00dcae2c;
    }
    this_00 = (Node *)Node::operator_new(0x48,&((((this->super_Node).Doc)->_M_t).
                                                super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                                .
                                                super__Head_base<0UL,_llvm::yaml::Document_*,_false>
                                               ._M_head_impl)->NodeAllocator,0x10);
    if (this_00 == (Node *)0x0) {
      this_00 = (Node *)0x0;
      goto LAB_00dcae2c;
    }
  }
  NullNode::NullNode((NullNode *)this_00,(this->super_Node).Doc);
LAB_00dcae2c:
  this->Key = this_00;
  return this_00;
}

Assistant:

Node *KeyValueNode::getKey() {
  if (Key)
    return Key;
  // Handle implicit null keys.
  {
    Token &t = peekNext();
    if (   t.Kind == Token::TK_BlockEnd
        || t.Kind == Token::TK_Value
        || t.Kind == Token::TK_Error) {
      return Key = new (getAllocator()) NullNode(Doc);
    }
    if (t.Kind == Token::TK_Key)
      getNext(); // skip TK_Key.
  }

  // Handle explicit null keys.
  Token &t = peekNext();
  if (t.Kind == Token::TK_BlockEnd || t.Kind == Token::TK_Value) {
    return Key = new (getAllocator()) NullNode(Doc);
  }

  // We've got a normal key.
  return Key = parseBlockNode();
}